

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BibIndexer.cpp
# Opt level: O2

bool __thiscall
BibIndexer::getEntryKey
          (BibIndexer *this,u16string *keyName,TSNode *entryNode,uint32_t *index,uint32_t childCount
          )

{
  TSNode self;
  TSSymbol TVar1;
  uint32_t child_index;
  TSNode node;
  u16string local_50;
  
  child_index = *index;
  do {
    if (childCount <= child_index) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&node,"Missign key name",(allocator<char> *)&local_50);
      addError(this,entryNode,MissingKeyName,(string *)&node);
      std::__cxx11::string::~string((string *)&node);
LAB_00171b41:
      return child_index < childCount;
    }
    ts_node_named_child(&node,*entryNode,child_index);
    self.context[2] = node.context[2];
    self.context[3] = node.context[3];
    self.context[0] = node.context[0];
    self.context[1] = node.context[1];
    self.id = node.id;
    self.tree = node.tree;
    TVar1 = ts_node_symbol(self);
    if (TVar1 == 0x1f) {
      File::textForNode_abi_cxx11_(&local_50,this->file,&node);
      std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
      operator=(keyName,&local_50);
      std::__cxx11::u16string::~u16string((u16string *)&local_50);
      goto LAB_00171b41;
    }
    child_index = *index + 1;
    *index = child_index;
  } while( true );
}

Assistant:

bool BibIndexer::getEntryKey (u16string &keyName, TSNode &entryNode, uint32_t &index, uint32_t childCount) {
    for (; index < childCount; index++) {
        TSNode node = ts_node_named_child(entryNode, index);
        switch (ts_node_symbol(node)) {
            case SymKey:
                keyName = file->textForNode(node);
                return true;
            default: {}
        }
    }

    addError(entryNode, Error::MissingKeyName, "Missign key name");
    return false;
}